

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# double-conversion.cc
# Opt level: O3

double __thiscall
FIX::double_conversion::StringToDoubleConverter::StringToIeee<unsigned_short_const*>
          (StringToDoubleConverter *this,unsigned_short *input,int length,bool read_as_double,
          int *processed_characters_count)

{
  unsigned_short *end;
  ushort uVar1;
  ushort uVar2;
  uint uVar3;
  char *pcVar4;
  double dVar5;
  undefined4 uVar6;
  bool bVar7;
  bool bVar8;
  uint uVar9;
  unsigned_short *puVar10;
  unsigned_short *puVar11;
  uint uVar12;
  undefined7 in_register_00000009;
  int iVar13;
  undefined8 unaff_RBX;
  byte bVar14;
  unsigned_short uVar15;
  int iVar16;
  uint uVar17;
  long lVar18;
  uint uVar19;
  long lVar20;
  int iVar21;
  int iVar22;
  ulong uVar23;
  uint uVar24;
  float fVar25;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dd;
  Vector<const_char> buffer_00;
  Vector<const_char> buffer_01;
  bool result_is_junk_1;
  char *start;
  char buffer [782];
  unsigned_short *local_398;
  uint local_38c;
  undefined4 local_388;
  bool local_381;
  int *local_380;
  ulong local_378;
  int local_36c;
  undefined1 local_368 [16];
  double_conversion *local_350;
  double_conversion local_348 [792];
  
  local_368._0_4_ = (int)CONCAT71(in_register_00000009,read_as_double);
  *processed_characters_count = 0;
  if (length == 0) {
LAB_0016a5c3:
    return this->empty_string_value_;
  }
  end = input + length;
  uVar3 = this->flags_;
  bVar14 = (byte)uVar3;
  local_398 = input;
  if ((uVar3 & 0x18) != 0) {
    do {
      uVar1 = *local_398;
      lVar18 = 0;
      if (uVar1 < 0x80) {
        while ((int)(char)(&kWhitespaceTable7)[lVar18] != (uint)uVar1) {
          lVar18 = lVar18 + 1;
          if (lVar18 == 6) goto LAB_0016a5ce;
        }
      }
      else {
        while (*(ushort *)((long)&kWhitespaceTable16 + lVar18) != uVar1) {
          lVar18 = lVar18 + 2;
          if (lVar18 == 0x28) goto LAB_0016a5ce;
        }
      }
      local_398 = local_398 + 1;
    } while (local_398 != end);
    *processed_characters_count = length;
    goto LAB_0016a5c3;
  }
  uVar1 = *input;
  goto LAB_0016a5f2;
LAB_0016a5ce:
  if (local_398 != input && (char)((uVar3 & 8) >> 3) == '\0') goto LAB_0016ac94;
LAB_0016a5f2:
  if ((uVar1 == 0x2d) || (uVar1 == 0x2b)) {
    local_388 = (undefined4)CONCAT71((int7)((ulong)unaff_RBX >> 8),uVar1 == 0x2d);
    if (local_398 + 1 != end) {
      lVar18 = 2;
      do {
        uVar1 = *(ushort *)((long)local_398 + lVar18);
        lVar20 = 0;
        if (uVar1 < 0x80) {
          while ((int)(char)(&kWhitespaceTable7)[lVar20] != (uint)uVar1) {
            lVar20 = lVar20 + 1;
            if (lVar20 == 6) goto LAB_0016a678;
          }
        }
        else {
          while (*(ushort *)((long)&kWhitespaceTable16 + lVar20) != uVar1) {
            lVar20 = lVar20 + 2;
            if (lVar20 == 0x28) goto LAB_0016a678;
          }
        }
        lVar20 = lVar18 + 2;
        lVar18 = lVar18 + 2;
      } while ((unsigned_short *)((long)local_398 + lVar20) != end);
    }
LAB_0016ac94:
    return this->junk_string_value_;
  }
  local_388 = 0;
LAB_0016a69c:
  uVar12 = (uint)uVar1;
  pcVar4 = this->infinity_symbol_;
  uVar9 = (uint)uVar1;
  bVar8 = SUB41(local_388,0);
  if ((pcVar4 != (char *)0x0) && (uVar9 == (int)*pcVar4)) {
    bVar7 = ConsumeSubString<unsigned_short_const*>(&local_398,end,pcVar4);
    if (((bVar7) && (local_398 == end || (uVar3 & 0x14) != 0)) &&
       (((uVar3 & 4) != 0 ||
        (bVar7 = AdvanceToNonspace<unsigned_short_const*>(&local_398,end), !bVar7)))) {
      *processed_characters_count = (int)((ulong)((long)local_398 - (long)input) >> 1);
      if (bVar8 != false) {
        return -INFINITY;
      }
      return INFINITY;
    }
    goto LAB_0016ac94;
  }
  pcVar4 = this->nan_symbol_;
  if ((pcVar4 != (char *)0x0) && (uVar9 == (int)*pcVar4)) {
    bVar7 = ConsumeSubString<unsigned_short_const*>(&local_398,end,pcVar4);
    if (((bVar7) && (local_398 == end || (uVar3 & 0x14) != 0)) &&
       (((uVar3 & 4) != 0 ||
        (bVar7 = AdvanceToNonspace<unsigned_short_const*>(&local_398,end), !bVar7)))) {
      *processed_characters_count = (int)((ulong)((long)local_398 - (long)input) >> 1);
      if (bVar8 != false) {
        return -NAN;
      }
      return NAN;
    }
    goto LAB_0016ac94;
  }
  iVar16 = 0;
  if (uVar1 == 0x30) {
    puVar10 = local_398 + 1;
    if (puVar10 != end) {
      if (((uVar3 & 1) != 0) && ((*puVar10 | 0x20) == 0x78)) {
        local_398 = local_398 + 2;
        if ((local_398 != end) &&
           ((uVar1 = *local_398, uVar1 < 0x40 && uVar1 - 0x30 < 10 ||
            ((uVar9 = uVar1 - 0x41, uVar9 < 0x26 &&
             ((0x3f0000003fU >> ((ulong)uVar9 & 0x3f) & 1) != 0)))))) {
          local_368._0_8_ =
               RadixStringToIeee<4,unsigned_short_const*>
                         (&local_398,end,bVar8,SUB41((uVar3 & 4) >> 2,0),this->junk_string_value_,
                          read_as_double,(bool *)local_348);
          if (local_348[0] != (double_conversion)0x0) {
            return (double)local_368._0_8_;
          }
          if ((uVar3 & 0x10) != 0) {
            local_368._8_4_ = extraout_XMM0_Dc;
            local_368._12_4_ = extraout_XMM0_Dd;
            AdvanceToNonspace<unsigned_short_const*>(&local_398,end);
          }
          *processed_characters_count = (int)((ulong)((long)local_398 - (long)input) >> 1);
          return (double)local_368._0_8_;
        }
        goto LAB_0016ac94;
      }
      do {
        if (*puVar10 != 0x30) {
          uVar17 = (uint)(bVar14 >> 1);
          goto LAB_0016a7b3;
        }
        puVar10 = puVar10 + 1;
      } while (puVar10 != end);
    }
    *processed_characters_count = length;
joined_r0x0016a97e:
    if (bVar8 == false) {
      return 0.0;
    }
    return -0.0;
  }
  uVar17 = 0;
  puVar10 = local_398;
LAB_0016a7b3:
  iVar21 = 0;
  bVar7 = false;
  uVar24 = 0;
  do {
    uVar2 = *puVar10;
    local_380 = processed_characters_count;
    if (9 < (ushort)(uVar2 - 0x30)) {
      uVar19 = uVar17;
      if (iVar16 == 0) {
        uVar19 = 0;
      }
      uVar23 = 0;
      puVar11 = puVar10;
      if (uVar2 != 0x2e) goto LAB_0016ab4c;
      if (((~(byte)uVar19 | bVar14 >> 2) & 1) == 0) goto LAB_0016ac94;
      local_398 = puVar10;
      if ((uVar19 & 1) == 0) {
        local_398 = puVar10 + 1;
        if (local_398 != end) {
          uVar23 = 0;
          puVar11 = local_398;
          if ((iVar16 != 0) || (*local_398 != 0x30)) goto LAB_0016aae0;
          uVar23 = 0;
          puVar10 = puVar10 + 2;
          goto LAB_0016aac0;
        }
        uVar19 = uVar17;
        if (iVar16 == 0) {
          if (uVar1 == 0x30) goto LAB_0016a9dd;
          goto LAB_0016ac94;
        }
      }
      uVar23 = 0;
      uVar9 = uVar12;
      puVar11 = local_398;
      goto LAB_0016a830;
    }
    if (iVar16 < 0x304) {
      if (0x30d < (int)uVar24) {
        __assert_fail("buffer_pos < kBufferSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/marlowa[P]quickfix/src/C++/double-conversion/double-conversion.cc"
                      ,0x319,
                      "double FIX::double_conversion::StringToDoubleConverter::StringToIeee(Iterator, int, bool, int *) const [Iterator = const unsigned short *]"
                     );
      }
      lVar18 = (long)(int)uVar24;
      uVar24 = uVar24 + 1;
      local_348[lVar18] = SUB21(uVar2,0);
      iVar16 = iVar16 + 1;
    }
    else {
      iVar21 = iVar21 + 1;
      bVar7 = (bool)(uVar2 != 0x30 | bVar7);
    }
    if ((uVar17 & 1) == 0) {
      uVar17 = 0;
    }
    else {
      uVar17 = (uint)(*puVar10 < 0x38);
    }
    puVar10 = puVar10 + 1;
  } while (puVar10 != end);
  uVar23 = 0;
  uVar9 = uVar12;
  puVar11 = end;
  uVar19 = uVar17;
  goto LAB_0016a830;
LAB_0016a678:
  if (lVar18 != 2 && (char)((uVar3 & 0x20) >> 5) == '\0') goto LAB_0016ac94;
  local_398 = (unsigned_short *)((long)local_398 + lVar18);
  goto LAB_0016a69c;
LAB_0016ab4c:
  iVar22 = (int)uVar23;
  if (((uVar1 != 0x30) && (iVar22 == 0)) && (iVar16 == 0)) goto LAB_0016ac94;
  uVar12 = uVar2 | 0x20;
  local_398 = puVar11;
  if (uVar12 == 0x65) {
    uVar9 = CONCAT31((int3)(uVar3 >> 8),bVar14 >> 2);
    if (((~(byte)uVar19 | bVar14 >> 2) & 1) == 0) goto LAB_0016ac94;
    if ((uVar19 & 1) == 0) {
      local_398 = puVar11 + 1;
      if (local_398 != end) {
        uVar1 = *local_398;
        uVar9 = (uint)uVar1;
        if ((((uVar1 != 0x2d) && (uVar12 = 0x2b, uVar1 != 0x2b)) ||
            (local_398 = puVar11 + 2, uVar12 = (uint)uVar1, local_398 != end)) &&
           ((uVar9 = uVar12, local_398 != end &&
            (uVar15 = *local_398, 0xfff5 < (ushort)(uVar15 - 0x3a))))) {
          local_38c = uVar9;
          if (0x3ffffffe < iVar22 + 0x1fffffffU) {
            __assert_fail("-max_exponent / 2 <= exponent && exponent <= max_exponent / 2",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/marlowa[P]quickfix/src/C++/double-conversion/double-conversion.cc"
                          ,0x380,
                          "double FIX::double_conversion::StringToDoubleConverter::StringToIeee(Iterator, int, bool, int *) const [Iterator = const unsigned short *]"
                         );
          }
          iVar16 = 0;
          uVar12 = uVar9;
          do {
            local_398 = local_398 + 1;
            if ((iVar16 < 0x6666666) ||
               ((iVar13 = 0x3fffffff, iVar16 == 0x6666666 && (uVar15 < 0x34)))) {
              iVar13 = (uint)uVar15 + iVar16 * 10 + -0x30;
            }
            iVar16 = iVar13;
          } while ((local_398 != end) &&
                  (uVar15 = *local_398, uVar12 = uVar19, (ushort)(uVar15 - 0x30) < 10));
          local_38c._0_1_ = (char)uVar9;
          iVar13 = -iVar16;
          if ((char)local_38c != '-') {
            iVar13 = iVar16;
          }
          uVar23 = (ulong)(uint)(iVar13 + iVar22);
          goto LAB_0016ac89;
        }
      }
      puVar11 = local_398;
      if ((uVar3 & 4) == 0) goto LAB_0016ac94;
    }
  }
  else {
LAB_0016ac89:
    if ((((uVar3 & 0x14) == 0) && (local_398 != end)) ||
       (((uVar3 & 4) == 0 &&
        (local_38c = uVar19, local_378 = uVar23, local_36c = iVar21,
        bVar8 = AdvanceToNonspace<unsigned_short_const*>(&local_398,end), uVar23 = local_378,
        iVar21 = local_36c, uVar19 = local_38c, bVar8)))) goto LAB_0016ac94;
    uVar9 = uVar12;
    puVar11 = local_398;
    if ((uVar3 & 0x10) != 0) {
      local_38c = uVar19;
      local_378 = uVar23;
      AdvanceToNonspace<unsigned_short_const*>(&local_398,end);
      uVar23 = local_378;
      uVar9 = uVar12;
      puVar11 = local_398;
      uVar19 = local_38c;
    }
  }
  goto LAB_0016a830;
  while( true ) {
    uVar23 = (ulong)((int)uVar23 - 1);
    puVar10 = puVar11 + 1;
    if (*puVar11 != 0x30) break;
LAB_0016aac0:
    puVar11 = puVar10;
    if (puVar11 == end) {
      *processed_characters_count = length;
      goto joined_r0x0016a97e;
    }
  }
LAB_0016aae0:
  do {
    uVar2 = *puVar11;
    if (9 < (ushort)(uVar2 - 0x30)) goto LAB_0016ab4c;
    if (iVar16 < 0x304) {
      if (0x30d < (int)uVar24) {
        __assert_fail("buffer_pos < kBufferSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/marlowa[P]quickfix/src/C++/double-conversion/double-conversion.cc"
                      ,0x349,
                      "double FIX::double_conversion::StringToDoubleConverter::StringToIeee(Iterator, int, bool, int *) const [Iterator = const unsigned short *]"
                     );
      }
      lVar18 = (long)(int)uVar24;
      uVar24 = uVar24 + 1;
      local_348[lVar18] = SUB21(uVar2,0);
      iVar16 = iVar16 + 1;
      uVar23 = (ulong)((int)uVar23 - 1);
    }
    else {
      bVar7 = (bool)(uVar2 != 0x30 | bVar7);
    }
    puVar11 = puVar11 + 1;
    uVar9 = uVar12;
  } while (puVar11 != end);
LAB_0016a830:
  local_398 = puVar11;
  if ((uVar19 & 1) != 0) {
    local_350 = local_348;
    dVar5 = RadixStringToIeee<3,char*>
                      ((char **)&local_350,(char *)(local_348 + (int)uVar24),local_388._0_1_,
                       SUB41((uVar3 & 4) >> 2,0),this->junk_string_value_,(bool)local_368[0],
                       &local_381);
    if (local_381 != true) {
      *local_380 = (int)((ulong)((long)local_398 - (long)input) >> 1);
      return dVar5;
    }
    __assert_fail("!result_is_junk",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/marlowa[P]quickfix/src/C++/double-conversion/double-conversion.cc"
                  ,0x3a9,
                  "double FIX::double_conversion::StringToDoubleConverter::StringToIeee(Iterator, int, bool, int *) const [Iterator = const unsigned short *]"
                 );
  }
  iVar21 = (int)uVar23 + iVar21;
LAB_0016a9dd:
  uVar6 = local_388;
  if (bVar7) {
    lVar18 = (long)(int)uVar24;
    uVar24 = uVar24 + 1;
    local_348[lVar18] = (double_conversion)0x31;
    iVar21 = iVar21 + -1;
  }
  if (0x30d < (int)uVar24) {
    __assert_fail("buffer_pos < kBufferSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/marlowa[P]quickfix/src/C++/double-conversion/double-conversion.cc"
                  ,0x3b3,
                  "double FIX::double_conversion::StringToDoubleConverter::StringToIeee(Iterator, int, bool, int *) const [Iterator = const unsigned short *]"
                 );
  }
  local_348[(int)uVar24] = (double_conversion)0x0;
  if (local_368[0] == '\0') {
    if ((int)uVar24 < 0) goto LAB_0016ad51;
    buffer_01.start_ = (ulong)uVar24;
    buffer_01.length_ = iVar21;
    buffer_01._12_4_ = 0;
    fVar25 = Strtof(local_348,buffer_01,uVar9);
    dVar5 = (double)fVar25;
  }
  else {
    if ((int)uVar24 < 0) {
LAB_0016ad51:
      __assert_fail("len == 0 || (len > 0 && data != __null)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/marlowa[P]quickfix/src/C++/double-conversion/utils.h"
                    ,0xb3,
                    "FIX::double_conversion::Vector<const char>::Vector(T *, int) [T = const char]")
      ;
    }
    buffer_00.start_ = (ulong)uVar24;
    buffer_00.length_ = iVar21;
    buffer_00._12_4_ = 0;
    dVar5 = Strtod(local_348,buffer_00,uVar9);
  }
  *local_380 = (int)((ulong)((long)local_398 - (long)input) >> 1);
  if ((char)uVar6 == '\0') {
    return dVar5;
  }
  return -dVar5;
}

Assistant:

double StringToDoubleConverter::StringToIeee(
    Iterator input,
    int length,
    bool read_as_double,
    int* processed_characters_count) const {
  Iterator current = input;
  Iterator end = input + length;

  *processed_characters_count = 0;

  const bool allow_trailing_junk = (flags_ & ALLOW_TRAILING_JUNK) != 0;
  const bool allow_leading_spaces = (flags_ & ALLOW_LEADING_SPACES) != 0;
  const bool allow_trailing_spaces = (flags_ & ALLOW_TRAILING_SPACES) != 0;
  const bool allow_spaces_after_sign = (flags_ & ALLOW_SPACES_AFTER_SIGN) != 0;

  // To make sure that iterator dereferencing is valid the following
  // convention is used:
  // 1. Each '++current' statement is followed by check for equality to 'end'.
  // 2. If AdvanceToNonspace returned false then current == end.
  // 3. If 'current' becomes equal to 'end' the function returns or goes to
  // 'parsing_done'.
  // 4. 'current' is not dereferenced after the 'parsing_done' label.
  // 5. Code before 'parsing_done' may rely on 'current != end'.
  if (current == end) return empty_string_value_;

  if (allow_leading_spaces || allow_trailing_spaces) {
    if (!AdvanceToNonspace(&current, end)) {
      *processed_characters_count = static_cast<int>(current - input);
      return empty_string_value_;
    }
    if (!allow_leading_spaces && (input != current)) {
      // No leading spaces allowed, but AdvanceToNonspace moved forward.
      return junk_string_value_;
    }
  }

  // The longest form of simplified number is: "-<significant digits>.1eXXX\0".
  const int kBufferSize = kMaxSignificantDigits + 10;
  char buffer[kBufferSize];  // NOLINT: size is known at compile time.
  int buffer_pos = 0;

  // Exponent will be adjusted if insignificant digits of the integer part
  // or insignificant leading zeros of the fractional part are dropped.
  int exponent = 0;
  int significant_digits = 0;
  int insignificant_digits = 0;
  bool nonzero_digit_dropped = false;

  bool sign = false;

  if (*current == '+' || *current == '-') {
    sign = (*current == '-');
    ++current;
    Iterator next_non_space = current;
    // Skip following spaces (if allowed).
    if (!AdvanceToNonspace(&next_non_space, end)) return junk_string_value_;
    if (!allow_spaces_after_sign && (current != next_non_space)) {
      return junk_string_value_;
    }
    current = next_non_space;
  }

  if (infinity_symbol_ != NULL) {
    if (*current == infinity_symbol_[0]) {
      if (!ConsumeSubString(&current, end, infinity_symbol_)) {
        return junk_string_value_;
      }

      if (!(allow_trailing_spaces || allow_trailing_junk) && (current != end)) {
        return junk_string_value_;
      }
      if (!allow_trailing_junk && AdvanceToNonspace(&current, end)) {
        return junk_string_value_;
      }

      ASSERT(buffer_pos == 0);
      *processed_characters_count = static_cast<int>(current - input);
      return sign ? -Double::Infinity() : Double::Infinity();
    }
  }

  if (nan_symbol_ != NULL) {
    if (*current == nan_symbol_[0]) {
      if (!ConsumeSubString(&current, end, nan_symbol_)) {
        return junk_string_value_;
      }

      if (!(allow_trailing_spaces || allow_trailing_junk) && (current != end)) {
        return junk_string_value_;
      }
      if (!allow_trailing_junk && AdvanceToNonspace(&current, end)) {
        return junk_string_value_;
      }

      ASSERT(buffer_pos == 0);
      *processed_characters_count = static_cast<int>(current - input);
      return sign ? -Double::NaN() : Double::NaN();
    }
  }

  bool leading_zero = false;
  if (*current == '0') {
    ++current;
    if (current == end) {
      *processed_characters_count = static_cast<int>(current - input);
      return SignedZero(sign);
    }

    leading_zero = true;

    // It could be hexadecimal value.
    if ((flags_ & ALLOW_HEX) && (*current == 'x' || *current == 'X')) {
      ++current;
      if (current == end || !isDigit(*current, 16)) {
        return junk_string_value_;  // "0x".
      }

      bool result_is_junk;
      double result = RadixStringToIeee<4>(&current,
                                           end,
                                           sign,
                                           allow_trailing_junk,
                                           junk_string_value_,
                                           read_as_double,
                                           &result_is_junk);
      if (!result_is_junk) {
        if (allow_trailing_spaces) AdvanceToNonspace(&current, end);
        *processed_characters_count = static_cast<int>(current - input);
      }
      return result;
    }

    // Ignore leading zeros in the integer part.
    while (*current == '0') {
      ++current;
      if (current == end) {
        *processed_characters_count = static_cast<int>(current - input);
        return SignedZero(sign);
      }
    }
  }

  bool octal = leading_zero && (flags_ & ALLOW_OCTALS) != 0;

  // Copy significant digits of the integer part (if any) to the buffer.
  while (*current >= '0' && *current <= '9') {
    if (significant_digits < kMaxSignificantDigits) {
      ASSERT(buffer_pos < kBufferSize);
      buffer[buffer_pos++] = static_cast<char>(*current);
      significant_digits++;
      // Will later check if it's an octal in the buffer.
    } else {
      insignificant_digits++;  // Move the digit into the exponential part.
      nonzero_digit_dropped = nonzero_digit_dropped || *current != '0';
    }
    octal = octal && *current < '8';
    ++current;
    if (current == end) goto parsing_done;
  }

  if (significant_digits == 0) {
    octal = false;
  }

  if (*current == '.') {
    if (octal && !allow_trailing_junk) return junk_string_value_;
    if (octal) goto parsing_done;

    ++current;
    if (current == end) {
      if (significant_digits == 0 && !leading_zero) {
        return junk_string_value_;
      } else {
        goto parsing_done;
      }
    }

    if (significant_digits == 0) {
      // octal = false;
      // Integer part consists of 0 or is absent. Significant digits start after
      // leading zeros (if any).
      while (*current == '0') {
        ++current;
        if (current == end) {
          *processed_characters_count = static_cast<int>(current - input);
          return SignedZero(sign);
        }
        exponent--;  // Move this 0 into the exponent.
      }
    }

    // There is a fractional part.
    // We don't emit a '.', but adjust the exponent instead.
    while (*current >= '0' && *current <= '9') {
      if (significant_digits < kMaxSignificantDigits) {
        ASSERT(buffer_pos < kBufferSize);
        buffer[buffer_pos++] = static_cast<char>(*current);
        significant_digits++;
        exponent--;
      } else {
        // Ignore insignificant digits in the fractional part.
        nonzero_digit_dropped = nonzero_digit_dropped || *current != '0';
      }
      ++current;
      if (current == end) goto parsing_done;
    }
  }

  if (!leading_zero && exponent == 0 && significant_digits == 0) {
    // If leading_zeros is true then the string contains zeros.
    // If exponent < 0 then string was [+-]\.0*...
    // If significant_digits != 0 the string is not equal to 0.
    // Otherwise there are no digits in the string.
    return junk_string_value_;
  }

  // Parse exponential part.
  if (*current == 'e' || *current == 'E') {
    if (octal && !allow_trailing_junk) return junk_string_value_;
    if (octal) goto parsing_done;
    ++current;
    if (current == end) {
      if (allow_trailing_junk) {
        goto parsing_done;
      } else {
        return junk_string_value_;
      }
    }
    char exponen_sign = '+';
    if (*current == '+' || *current == '-') {
      exponen_sign = static_cast<char>(*current);
      ++current;
      if (current == end) {
        if (allow_trailing_junk) {
          goto parsing_done;
        } else {
          return junk_string_value_;
        }
      }
    }

    if (current == end || *current < '0' || *current > '9') {
      if (allow_trailing_junk) {
        goto parsing_done;
      } else {
        return junk_string_value_;
      }
    }

    const int max_exponent = INT_MAX / 2;
    ASSERT(-max_exponent / 2 <= exponent && exponent <= max_exponent / 2);
    int num = 0;
    do {
      // Check overflow.
      int digit = *current - '0';
      if (num >= max_exponent / 10
          && !(num == max_exponent / 10 && digit <= max_exponent % 10)) {
        num = max_exponent;
      } else {
        num = num * 10 + digit;
      }
      ++current;
    } while (current != end && *current >= '0' && *current <= '9');

    exponent += (exponen_sign == '-' ? -num : num);
  }

  if (!(allow_trailing_spaces || allow_trailing_junk) && (current != end)) {
    return junk_string_value_;
  }
  if (!allow_trailing_junk && AdvanceToNonspace(&current, end)) {
    return junk_string_value_;
  }
  if (allow_trailing_spaces) {
    AdvanceToNonspace(&current, end);
  }

  parsing_done:
  exponent += insignificant_digits;

  if (octal) {
    double result;
    bool result_is_junk;
    char* start = buffer;
    result = RadixStringToIeee<3>(&start,
                                  buffer + buffer_pos,
                                  sign,
                                  allow_trailing_junk,
                                  junk_string_value_,
                                  read_as_double,
                                  &result_is_junk);
    ASSERT(!result_is_junk);
    *processed_characters_count = static_cast<int>(current - input);
    return result;
  }

  if (nonzero_digit_dropped) {
    buffer[buffer_pos++] = '1';
    exponent--;
  }

  ASSERT(buffer_pos < kBufferSize);
  buffer[buffer_pos] = '\0';

  double converted;
  if (read_as_double) {
    converted = Strtod(Vector<const char>(buffer, buffer_pos), exponent);
  } else {
    converted = Strtof(Vector<const char>(buffer, buffer_pos), exponent);
  }
  *processed_characters_count = static_cast<int>(current - input);
  return sign? -converted: converted;
}